

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPInternalSourceData::ProcessBYEPacket
          (RTPInternalSourceData *this,uint8_t *reason,size_t reasonlen,RTPTime *receivetime)

{
  uint8_t **ppuVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  uint8_t *puVar4;
  
  ppuVar1 = &(this->super_RTPSourceData).byereason;
  puVar4 = (this->super_RTPSourceData).byereason;
  if (puVar4 != (uint8_t *)0x0) {
    pRVar2 = (this->super_RTPSourceData).super_RTPMemoryObject.mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      operator_delete__(puVar4);
    }
    else {
      (**(code **)(*(long *)pRVar2 + 0x18))();
    }
    *ppuVar1 = (uint8_t *)0x0;
    (this->super_RTPSourceData).byereasonlen = 0;
  }
  (this->super_RTPSourceData).byetime.m_t = receivetime->m_t;
  pRVar2 = (this->super_RTPSourceData).super_RTPMemoryObject.mgr;
  if (pRVar2 == (RTPMemoryManager *)0x0) {
    puVar4 = (uint8_t *)operator_new__(reasonlen);
  }
  else {
    puVar4 = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,reasonlen,5);
  }
  *ppuVar1 = puVar4;
  if (puVar4 == (uint8_t *)0x0) {
    iVar3 = -1;
  }
  else {
    memcpy(puVar4,reason,reasonlen);
    (this->super_RTPSourceData).byereasonlen = reasonlen;
    (this->super_RTPSourceData).receivedbye = true;
    (this->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int RTPInternalSourceData::ProcessBYEPacket(const uint8_t *reason,size_t reasonlen,const RTPTime &receivetime)
{
	if (byereason)
	{
		RTPDeleteByteArray(byereason,GetMemoryManager());
		byereason = 0;
		byereasonlen = 0;
	}

	byetime = receivetime;
	byereason = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEREASON) uint8_t[reasonlen];
	if (byereason == 0)
		return ERR_RTP_OUTOFMEM;
	memcpy(byereason,reason,reasonlen);
	byereasonlen = reasonlen;
	receivedbye = true;
	stats.SetLastMessageTime(receivetime);
	return 0;
}